

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O3

int xmlRelaxNGCompareNameClasses
              (xmlRelaxNGDefinePtr_conflict def1,xmlRelaxNGDefinePtr_conflict def2)

{
  xmlChar *pxVar1;
  int iVar2;
  xmlNs ns;
  xmlRelaxNGValidCtxt ctxt;
  xmlNs local_180;
  xmlNode local_150;
  xmlRelaxNGValidCtxt local_d8;
  
  memset(&local_d8,0,0xc0);
  local_d8.flags = 9;
  switch(def1->type) {
  case XML_RELAXNG_EXCEPT:
    iVar2 = xmlRelaxNGCompareNameClasses(def1->content,def2);
    if (iVar2 != 0) {
      return 0;
    }
    break;
  case XML_RELAXNG_TEXT:
    return (uint)(def2->type != XML_RELAXNG_TEXT);
  case XML_RELAXNG_ELEMENT:
  case XML_RELAXNG_ATTRIBUTE:
    if (def2->type == XML_RELAXNG_TEXT) {
      return 1;
    }
    local_150.name = (xmlChar *)"\x01";
    if (def1->name != (xmlChar *)0x0) {
      local_150.name = def1->name;
    }
    pxVar1 = def1->ns;
    if ((pxVar1 == (xmlChar *)0x0) || (*pxVar1 == '\0')) {
      local_150.ns = (xmlNs *)0x0;
    }
    else {
      local_150.ns = &local_180;
      local_180.href = pxVar1;
    }
    iVar2 = xmlRelaxNGElementMatch(&local_d8,def2,&local_150);
    if (iVar2 != 0) {
      if (def1->nameClass == (xmlRelaxNGDefinePtr_conflict)0x0) {
        return 0;
      }
      iVar2 = xmlRelaxNGCompareNameClasses(def1->nameClass,def2);
      if (iVar2 == 0) {
        return 0;
      }
    }
    break;
  default:
    goto LAB_0018ab24;
  }
  if ((def2->type == XML_RELAXNG_ATTRIBUTE) || (def2->type == XML_RELAXNG_ELEMENT)) {
    local_150.name = def2->name;
    if (local_150.name == (xmlChar *)0x0) {
      local_150.name = "\x01";
    }
    local_150.ns = &local_180;
    pxVar1 = def2->ns;
    if (pxVar1 == (xmlChar *)0x0) {
      local_180.href = "\x01";
      pxVar1 = local_180.href;
    }
    else if (*pxVar1 == '\0') {
      local_150.ns = (xmlNs *)0x0;
      pxVar1 = local_180.href;
    }
    local_180.href = pxVar1;
    iVar2 = xmlRelaxNGElementMatch(&local_d8,def1,&local_150);
    if (iVar2 == 0) {
      return 1;
    }
    if (def2->nameClass != (xmlRelaxNGDefinePtr_conflict)0x0) {
      iVar2 = xmlRelaxNGCompareNameClasses(def2->nameClass,def1);
      return iVar2;
    }
    return 0;
  }
LAB_0018ab24:
  return 0;
}

Assistant:

static int
xmlRelaxNGCompareNameClasses(xmlRelaxNGDefinePtr def1,
                             xmlRelaxNGDefinePtr def2)
{
    int ret = 1;
    xmlNode node;
    xmlNs ns;
    xmlRelaxNGValidCtxt ctxt;

    memset(&ctxt, 0, sizeof(xmlRelaxNGValidCtxt));

    ctxt.flags = FLAGS_IGNORABLE | FLAGS_NOERROR;

    if ((def1->type == XML_RELAXNG_ELEMENT) ||
        (def1->type == XML_RELAXNG_ATTRIBUTE)) {
        if (def2->type == XML_RELAXNG_TEXT)
            return (1);
        if (def1->name != NULL) {
            node.name = def1->name;
        } else {
            node.name = invalidName;
        }
        if (def1->ns != NULL) {
            if (def1->ns[0] == 0) {
                node.ns = NULL;
            } else {
	        node.ns = &ns;
                ns.href = def1->ns;
            }
        } else {
            node.ns = NULL;
        }
        if (xmlRelaxNGElementMatch(&ctxt, def2, &node)) {
            if (def1->nameClass != NULL) {
                ret = xmlRelaxNGCompareNameClasses(def1->nameClass, def2);
            } else {
                ret = 0;
            }
        } else {
            ret = 1;
        }
    } else if (def1->type == XML_RELAXNG_TEXT) {
        if (def2->type == XML_RELAXNG_TEXT)
            return (0);
        return (1);
    } else if (def1->type == XML_RELAXNG_EXCEPT) {
        ret = xmlRelaxNGCompareNameClasses(def1->content, def2);
	if (ret == 0)
	    ret = 1;
	else if (ret == 1)
	    ret = 0;
    } else {
        /* TODO */
        ret = 0;
    }
    if (ret == 0)
        return (ret);
    if ((def2->type == XML_RELAXNG_ELEMENT) ||
        (def2->type == XML_RELAXNG_ATTRIBUTE)) {
        if (def2->name != NULL) {
            node.name = def2->name;
        } else {
            node.name = invalidName;
        }
        node.ns = &ns;
        if (def2->ns != NULL) {
            if (def2->ns[0] == 0) {
                node.ns = NULL;
            } else {
                ns.href = def2->ns;
            }
        } else {
            ns.href = invalidName;
        }
        if (xmlRelaxNGElementMatch(&ctxt, def1, &node)) {
            if (def2->nameClass != NULL) {
                ret = xmlRelaxNGCompareNameClasses(def2->nameClass, def1);
            } else {
                ret = 0;
            }
        } else {
            ret = 1;
        }
    } else {
        /* TODO */
        ret = 0;
    }

    return (ret);
}